

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O1

int compare_list(char **name,void **l,zip_uint64_t *n,int size,_func_int_void_ptr_void_ptr *cmp,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_void_ptr *print)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  uint local_50 [2];
  void **local_48;
  _func_int_char_ptr_ptr_void_ptr_void_ptr *local_40;
  _func_int_void_ptr_void_ptr *local_38;
  
  local_38 = cmp;
  local_50[0] = 0;
  local_50[1] = 0;
  uVar5 = (ulong)(uint)size;
  if (*n == 0) {
    iVar6 = 0;
    uVar9 = 0;
    uVar4 = 0;
  }
  else {
    local_40 = check;
    local_48 = l + 1;
    uVar4 = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      iVar6 = (int)uVar7;
      if (n[1] <= uVar7) break;
      iVar1 = (*local_38)(*l,l[1]);
      ppvVar3 = local_48;
      if (iVar1 == 0) {
        if (local_40 != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
          uVar2 = (*local_40)(name,*l,l[1]);
          uVar4 = uVar4 | uVar2;
        }
        *l = (void *)((long)*l + uVar5);
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)(iVar6 + 1);
        ppvVar3 = local_48;
      }
      else if (iVar1 < 0) {
        if (verbose != 0 && header_done == 0) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",0x2d);
          (*print)(*l);
        }
        uVar9 = uVar9 + 1;
        uVar4 = 1;
        ppvVar3 = l;
      }
      else {
        if (verbose != 0 && header_done == 0) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",0x2b);
          (*print)(*ppvVar3);
        }
        uVar7 = (ulong)(iVar6 + 1);
        uVar4 = 1;
      }
      iVar6 = (int)uVar7;
      *ppvVar3 = (void *)((long)*ppvVar3 + uVar5);
    } while ((ulong)uVar9 < *n);
  }
  local_50[1] = iVar6;
  local_50[0] = uVar9;
  lVar8 = 0;
  do {
    uVar9 = local_50[lVar8];
    uVar7 = (ulong)uVar9;
    if (uVar7 < n[lVar8]) {
      do {
        if ((header_done == 0) && (verbose != 0)) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",(ulong)((uint)(lVar8 == 0) * 2 + 0x2b));
          (*print)(l[lVar8]);
        }
        l[lVar8] = (void *)((long)l[lVar8] + uVar5);
        uVar9 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar9;
      } while (uVar7 < n[lVar8]);
      uVar4 = 1;
    }
    local_50[lVar8] = uVar9;
    bVar10 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar10);
  return uVar4;
}

Assistant:

static int
compare_list(char *const name[2], const void *l[2], const zip_uint64_t n[2], int size, int (*cmp)(const void *, const void *), int (*check)(char *const name[2], const void *, const void *), void (*print)(const void *)) {
    unsigned int i[2];
    int j, c;
    int diff;

#define INC(k) (i[k]++, l[k] = ((const char *)l[k]) + size)
#define PRINT(k)                                          \
    do {                                                  \
	if (header_done == 0 && verbose) {                \
	    printf("--- %s\n+++ %s\n", name[0], name[1]); \
	    header_done = 1;                              \
	}                                                 \
	if (verbose) {                                    \
	    printf("%c ", (k) ? '+' : '-');               \
	    print(l[k]);                                  \
	}                                                 \
	diff = 1;                                         \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < n[0] && i[1] < n[1]) {
	c = cmp(l[0], l[1]);

	if (c == 0) {
	    if (check)
		diff |= check(name, l[0], l[1]);
	    INC(0);
	    INC(1);
	}
	else if (c < 0) {
	    PRINT(0);
	    INC(0);
	}
	else {
	    PRINT(1);
	    INC(1);
	}
    }

    for (j = 0; j < 2; j++) {
	while (i[j] < n[j]) {
	    PRINT(j);
	    INC(j);
	}
    }

    return diff;
}